

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

Diagnostics * __thiscall
slang::DiagnosticEngine::setMappingsFromPragmas
          (Diagnostics *__return_storage_ptr__,DiagnosticEngine *this)

{
  anon_class_16_2_f7aba355 local_30;
  undefined1 local_19;
  DiagnosticEngine *local_18;
  DiagnosticEngine *this_local;
  Diagnostics *diags;
  
  local_19 = 0;
  local_18 = this;
  this_local = (DiagnosticEngine *)__return_storage_ptr__;
  Diagnostics::Diagnostics(__return_storage_ptr__);
  local_30.this = this;
  local_30.diags = __return_storage_ptr__;
  SourceManager::visitDiagnosticDirectives<slang::DiagnosticEngine::setMappingsFromPragmas()::__0>
            (this->sourceManager,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Diagnostics DiagnosticEngine::setMappingsFromPragmas() {
    Diagnostics diags;
    sourceManager.visitDiagnosticDirectives([&](BufferID buffer, auto& directives) {
        setMappingsFromPragmasImpl<SourceManager::DiagnosticDirectiveInfo>(buffer, directives,
                                                                           diags);
    });

    return diags;
}